

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_compressBegin_usingDict_deprecated
                 (ZSTD_CCtx *cctx,void *dict,size_t dictSize,int compressionLevel)

{
  size_t sVar1;
  ZSTD_parameters params;
  ZSTD_CCtx_params cctxParams;
  ZSTD_cParamMode_e in_stack_fffffffffffffeec;
  size_t in_stack_fffffffffffffef0;
  unsigned_long_long in_stack_fffffffffffffef8;
  int in_stack_ffffffffffffff04;
  ZSTD_parameters *in_stack_ffffffffffffff08;
  ZSTD_CCtx_params *in_stack_ffffffffffffff10;
  ZSTD_CDict *in_stack_ffffffffffffff38;
  ZSTD_dictTableLoadMethod_e in_stack_ffffffffffffff40;
  ZSTD_dictContentType_e in_stack_ffffffffffffff44;
  size_t in_stack_ffffffffffffff48;
  void *in_stack_ffffffffffffff50;
  ZSTD_CCtx *in_stack_ffffffffffffff58;
  ZSTD_CCtx_params *in_stack_ffffffffffffff80;
  U64 in_stack_ffffffffffffff88;
  ZSTD_buffered_policy_e in_stack_ffffffffffffff90;
  
  ZSTD_getParams_internal
            (in_stack_ffffffffffffff04,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
             in_stack_fffffffffffffeec);
  ZSTD_CCtxParams_init_internal
            (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,in_stack_ffffffffffffff04);
  sVar1 = ZSTD_compressBegin_internal
                    (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                     in_stack_ffffffffffffff44,in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
                     in_stack_ffffffffffffff80,in_stack_ffffffffffffff88,in_stack_ffffffffffffff90);
  return sVar1;
}

Assistant:

static size_t
ZSTD_compressBegin_usingDict_deprecated(ZSTD_CCtx* cctx, const void* dict, size_t dictSize, int compressionLevel)
{
    ZSTD_CCtx_params cctxParams;
    {   ZSTD_parameters const params = ZSTD_getParams_internal(compressionLevel, ZSTD_CONTENTSIZE_UNKNOWN, dictSize, ZSTD_cpm_noAttachDict);
        ZSTD_CCtxParams_init_internal(&cctxParams, &params, (compressionLevel == 0) ? ZSTD_CLEVEL_DEFAULT : compressionLevel);
    }
    DEBUGLOG(4, "ZSTD_compressBegin_usingDict (dictSize=%u)", (unsigned)dictSize);
    return ZSTD_compressBegin_internal(cctx, dict, dictSize, ZSTD_dct_auto, ZSTD_dtlm_fast, NULL,
                                       &cctxParams, ZSTD_CONTENTSIZE_UNKNOWN, ZSTDb_not_buffered);
}